

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1L1Q1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *__return_storage_ptr__,
                   vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                   *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                           *plPair,
                   vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                   *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                          *lCPair)

{
  float *pfVar1;
  float *pfVar2;
  iterator iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *this;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  SrcEvaluatorType srcEvaluator_2;
  long lVar12;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar13;
  ostream *poVar14;
  DstXprType *pDVar15;
  float *pfVar16;
  float fVar17;
  Scalar SVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  DstEvaluatorType dstEvaluator_2;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_6,_1,_0,_6,_1> L2;
  Matrix<float,_6,_1,_0,_6,_1> L1;
  Matrix<float,_4,_4,_0,_4,_4> TF1;
  DstEvaluatorType dstEvaluator_3;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Matrix<float,_4,_4,_0,_4,_4> TF2;
  Matrix<float,_6,_6,_0,_6,_6> transLineV;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_6,_6,_0,_6,_6> transLineU;
  float local_53c;
  undefined1 local_538 [16];
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8 [4];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_4d8;
  Matrix<float,_4,_4,_0,_4,_4> *local_4d0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *pgStack_4c8;
  undefined8 local_4c0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_4b8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_4b0;
  undefined8 local_4a0;
  undefined1 local_498 [8];
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  float fStack_450;
  undefined4 uStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float local_424;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float local_404;
  undefined8 local_3f8;
  float afStack_3f0 [2];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_3d0;
  float local_3c8;
  Scalar local_3c4;
  Scalar local_3c0;
  Scalar local_3bc;
  Scalar local_3b8;
  Scalar local_3b4;
  Scalar local_3b0;
  Scalar local_3ac;
  Scalar local_3a8;
  Scalar local_3a4;
  Scalar local_3a0;
  Scalar local_39c;
  DstXprType local_398;
  undefined8 uStack_360;
  undefined1 local_358 [12];
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 *local_2c8;
  assign_op<float,_float> *local_2c0;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_2a0;
  undefined1 local_288 [8];
  SrcEvaluatorType *pSStack_280;
  assign_op<float,_float> *local_278;
  DstXprType *pDStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [12];
  float fStack_23c;
  float local_238;
  float local_234;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float local_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float local_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  undefined1 auStack_1f4 [60];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  undefined4 uStack_17c;
  undefined1 local_178 [12];
  float fStack_16c;
  float local_168;
  float local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  float local_14c;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float local_134;
  float local_130;
  float fStack_12c;
  float fStack_128;
  Matrix<float,_4,_4,_0,_4,_4> MStack_124;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Matrix<float,_3,_1,_0,_3,_1> local_90;
  Matrix<float,_3,_1,_0,_3,_1> local_84;
  Matrix<float,_4,_1,_0,_4,_1> local_78;
  Matrix<float,_4,_1,_0,_4,_1> local_68;
  Matrix<float,_4,_1,_0,_4,_1> local_58;
  Matrix<float,_4,_1,_0,_4,_1> local_48;
  
  pfVar16 = *(float **)ptPair;
  if (((*(float **)(ptPair + 8) == pfVar16) ||
      (pfVar1 = *(float **)lPair, *(float **)(lPair + 8) == pfVar1)) ||
     (pfVar2 = *(float **)plPair, *(float **)(plPair + 8) == pfVar2)) {
    poVar14 = std::operator<<((ostream *)&std::cerr,
                              "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!");
    std::endl<char,std::char_traits<char>>(poVar14);
    exit(-1);
  }
  _local_318 = *(undefined8 *)pfVar16;
  _fStack_310 = *(undefined8 *)(pfVar16 + 2);
  local_3f8 = *(ulong *)(pfVar16 + 4);
  afStack_3f0 = *(float (*) [2])(pfVar16 + 6);
  local_458 = *(ulong *)pfVar2;
  _fStack_450 = *(undefined8 *)(pfVar2 + 2);
  _local_528 = *(undefined8 *)(pfVar2 + 4);
  _fStack_520 = *(undefined8 *)(pfVar2 + 6);
  fVar20 = *pfVar1;
  fVar21 = pfVar1[1];
  fVar19 = pfVar1[2];
  fVar22 = pfVar1[3];
  fVar23 = pfVar1[4];
  fVar24 = pfVar1[5];
  fVar17 = pfVar1[6];
  fVar25 = pfVar1[7];
  local_448 = *(undefined8 *)(pfVar1 + 8);
  uStack_440 = *(undefined8 *)(pfVar1 + 10);
  _local_3e8 = *(undefined1 (*) [16])(pfVar1 + 0xc);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar20 = fVar20 / fVar22;
  fVar21 = fVar21 / fVar22;
  fVar19 = fVar19 / fVar22;
  fVar23 = fVar23 / fVar25;
  fVar24 = fVar24 / fVar25;
  fVar17 = fVar17 / fVar25;
  unique0x00005300 = (long)local_418;
  local_418._4_4_ = fVar24 - fVar21;
  local_418._0_4_ = fVar23 - fVar20;
  fStack_410 = fVar17 - fVar19;
  local_408 = fVar17 * fVar20 - fVar19 * fVar23;
  local_404 = fVar23 * fVar21 - fVar24 * fVar20;
  fStack_40c = fVar24 * fVar19 - fVar21 * fVar17;
  stack0xfffffffffffffe90 = 3;
  uStack_158 = 0;
  local_148 = 6;
  local_3d0 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  local_178._0_8_ = unique0x00005300;
  local_160 = (XprTypeNested)unique0x00005300;
  SVar18 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_248,(scalar_sum_op<float,_float> *)local_518,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_178);
  fVar21 = fStack_3e0 / fStack_3dc;
  fVar23 = (float)local_3e8._4_4_ / fStack_3dc;
  fVar17 = (float)local_3e8._0_4_ / fStack_3dc;
  fVar22 = (float)uStack_440 / uStack_440._4_4_;
  fVar19 = local_448._4_4_ / uStack_440._4_4_;
  fVar24 = (float)local_448 / uStack_440._4_4_;
  fVar20 = SQRT(SVar18);
  auVar5._4_4_ = fVar20;
  auVar5._0_4_ = fVar20;
  auVar5._8_4_ = fVar20;
  auVar5._12_4_ = fVar20;
  _local_418 = divps(_local_418,auVar5);
  local_408 = local_408 / fVar20;
  local_404 = local_404 / fVar20;
  unique0x00005300 = (long)local_438;
  local_438._4_4_ = fVar23 - fVar19;
  local_438._0_4_ = fVar17 - fVar24;
  fStack_430 = fVar21 - fVar22;
  local_428 = fVar21 * fVar24 - fVar22 * fVar17;
  local_424 = fVar19 * fVar17 - fVar24 * fVar23;
  fStack_42c = fVar23 * fVar22 - fVar19 * fVar21;
  stack0xfffffffffffffe90 = 3;
  uStack_158 = 0;
  local_148 = 6;
  local_178._0_8_ = unique0x00005300;
  local_160 = (XprTypeNested)unique0x00005300;
  SVar18 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_248,(scalar_sum_op<float,_float> *)local_518,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_178);
  fVar20 = SQRT(SVar18);
  auVar4._4_4_ = fVar20;
  auVar4._0_4_ = fVar20;
  auVar4._8_4_ = fVar20;
  auVar4._12_4_ = fVar20;
  _local_438 = divps(_local_438,auVar4);
  local_428 = local_428 / fVar20;
  local_424 = local_424 / fVar20;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_318;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       fStack_314;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       fStack_310;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       fStack_30c;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (float)local_3f8;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       local_3f8._4_4_;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       afStack_3f0[0];
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       afStack_3f0[1];
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (float)local_458;
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       local_458._4_4_;
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       fStack_450;
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       uStack_44c;
  local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_528;
  local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       fStack_524;
  local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       fStack_520;
  local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       fStack_51c;
  getPredefinedTransformations1L1Q1P<float>(&local_2a0,&local_48,&local_58,&local_68,&local_78);
  local_1b8.m_dst =
       *(DstEvaluatorType **)
        local_2a0.
        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_1b8.m_src =
       *(SrcEvaluatorType **)
        (local_2a0.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_1b8.m_functor =
       *(assign_op<float,_float> **)
        (local_2a0.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
  local_1b8.m_dstExpr =
       *(DstXprType **)
        (local_2a0.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
  local_198 = *(undefined8 *)
               (local_2a0.
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
               8);
  uStack_190 = *(undefined8 *)
                (local_2a0.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                + 10);
  uVar6 = *(undefined8 *)
           (local_2a0.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar7 = *(undefined8 *)
           (local_2a0.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe
           );
  local_188 = (float)uVar6;
  fStack_184 = (float)((ulong)uVar6 >> 0x20);
  fStack_180 = (float)uVar7;
  uStack_17c = (undefined4)((ulong)uVar7 >> 0x20);
  local_498 = *(undefined1 (*) [8])
               local_2a0.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  uStack_490 = *(SrcEvaluatorType **)
                (local_2a0.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-2].
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                + 2);
  local_488 = *(assign_op<float,_float> **)
               (local_2a0.
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
               4);
  uStack_480 = *(DstXprType **)
                (local_2a0.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-2].
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                + 6);
  local_478 = *(undefined8 *)
               (local_2a0.
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
               8);
  uStack_470 = *(undefined8 *)
                (local_2a0.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-2].
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                + 10);
  uVar6 = *(undefined8 *)
           (local_2a0.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-2].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar7 = *(undefined8 *)
           (local_2a0.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-2].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe
           );
  local_468 = (float)uVar6;
  fStack_464 = (float)((ulong)uVar6 >> 0x20);
  fStack_460 = (float)uVar7;
  fStack_45c = (float)((ulong)uVar7 >> 0x20);
  local_2a0.
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2a0.
       super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  memset((XprTypeNested)local_178,0,0x90);
  memset(local_248,0,0x90);
  uStack_510 = (SrcEvaluatorType *)0x3;
  local_508 = (assign_op<float,_float> *)0x3;
  local_4f8._0_4_ = 0.0;
  local_4f8._4_4_ = 0.0;
  uStack_4f0._0_4_ = 0.0;
  uStack_4f0._4_4_ = 0.0;
  local_4e8[0] = 8.40779e-45;
  local_4e8[1] = 0.0;
  pDVar15 = &local_398;
  local_2f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_358;
  local_518 = (undefined1  [8])local_178;
  uStack_500 = (XprTypeNested)local_178;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_498;
  local_308 = (undefined1  [8])local_288;
  uStack_300 = pDVar15;
  uStack_2f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_518;
  local_288 = (undefined1  [8])local_178;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_308);
  local_518 = (undefined1  [8])&MStack_124;
  uStack_510 = (SrcEvaluatorType *)0x3;
  local_508 = (assign_op<float,_float> *)0x3;
  local_4f8._0_4_ = 4.2039e-45;
  local_4f8._4_4_ = 0.0;
  uStack_4f0._0_4_ = 4.2039e-45;
  uStack_4f0._4_4_ = 0.0;
  local_4e8[0] = 8.40779e-45;
  local_4e8[1] = 0.0;
  local_2f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_358;
  uStack_500 = (XprTypeNested)local_178;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_498;
  local_308 = (undefined1  [8])local_288;
  uStack_300 = pDVar15;
  uStack_2f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_518;
  local_288 = local_518;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_308);
  local_84.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_468;
  local_84.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fStack_460;
  local_84.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       fStack_464;
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_288,&local_84);
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       &fStack_16c;
  local_4d0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
  pgStack_4c8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)0x0;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.m_value
       = 3;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.m_value
       = 0;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride = 6;
  local_2d8 = 3;
  local_518 = (undefined1  [8])((ulong)local_288 ^ 0x8000000080000000);
  uStack_510 = (SrcEvaluatorType *)((ulong)pSStack_280 ^ 0x8000000080000000);
  local_508 = (assign_op<float,_float> *)((ulong)local_278 ^ 0x8000000080000000);
  uStack_500 = (XprTypeNested)((ulong)pDStack_270 ^ 0x8000000080000000);
  local_4f8 = CONCAT44(local_4f8._4_4_,(float)local_268) ^ 0x80000000;
  uStack_4f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_498;
  local_4e8[0] = 4.2039e-45;
  local_4e8[1] = 0.0;
  local_4e8[2] = 4.2039e-45;
  local_4e8[3] = 0.0;
  local_4c0 = 4;
  local_4a0 = 3;
  local_358._0_8_ = local_538;
  local_538._0_8_ = local_308;
  local_4d8 = uStack_4f0;
  local_4b8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_518;
  local_4b0 = uStack_4f0;
  local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)local_178;
  unique0x10003d1c =
       (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
        *)local_518;
  local_348 = (assign_op<float,_float> *)&local_53c;
  uStack_340 = (float *)local_308;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_358);
  if ((local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
       m_value == 3) &&
     (local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
      m_value == local_2d8)) {
    local_358._0_8_ =
         local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data;
    uStack_510 = (SrcEvaluatorType *)local_538;
    local_538._0_8_ = local_308;
    local_518 = (undefined1  [8])local_358;
    local_508 = (assign_op<float,_float> *)&local_53c;
    uStack_500 = (XprTypeNested)pDVar15;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_518);
    uStack_510 = (SrcEvaluatorType *)0x3;
    local_508 = (assign_op<float,_float> *)0x3;
    local_4f8._0_4_ = 0.0;
    local_4f8._4_4_ = 0.0;
    uStack_4f0._0_4_ = 0.0;
    uStack_4f0._4_4_ = 0.0;
    local_4e8[0] = 8.40779e-45;
    local_4e8[1] = 0.0;
    local_308 = (undefined1  [8])local_288;
    local_518 = (undefined1  [8])local_248;
    uStack_500 = (XprTypeNested)local_248;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_1b8;
    uStack_300 = pDVar15;
    local_2f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_358;
    uStack_2f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_518;
    local_288 = (undefined1  [8])local_248;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_308);
    local_518 = (undefined1  [8])auStack_1f4;
    uStack_510 = (SrcEvaluatorType *)0x3;
    local_508 = (assign_op<float,_float> *)0x3;
    local_4f8._0_4_ = 4.2039e-45;
    local_4f8._4_4_ = 0.0;
    uStack_4f0._0_4_ = 4.2039e-45;
    uStack_4f0._4_4_ = 0.0;
    local_4e8[0] = 8.40779e-45;
    local_4e8[1] = 0.0;
    local_308 = (undefined1  [8])local_288;
    uStack_500 = (XprTypeNested)local_248;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_1b8;
    uStack_300 = pDVar15;
    local_2f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_358;
    uStack_2f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_518;
    local_288 = local_518;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_308);
    local_90.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_188;
    local_90.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         fStack_180;
    local_90.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         fStack_184;
    pfVar16 = (float *)local_288;
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)pfVar16,&local_90);
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         &fStack_23c;
    local_4d0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
    pgStack_4c8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)0x0;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)local_248;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
    m_value = 3;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_2d8 = 3;
    local_518 = (undefined1  [8])((ulong)local_288 ^ 0x8000000080000000);
    uStack_510 = (SrcEvaluatorType *)((ulong)pSStack_280 ^ 0x8000000080000000);
    local_508 = (assign_op<float,_float> *)((ulong)local_278 ^ 0x8000000080000000);
    uStack_500 = (XprTypeNested)((ulong)pDStack_270 ^ 0x8000000080000000);
    local_4f8 = CONCAT44(local_4f8._4_4_,(float)local_268) ^ 0x80000000;
    uStack_4f0 = &local_1b8;
    local_4e8[0] = 4.2039e-45;
    local_4e8[1] = 0.0;
    local_4e8[2] = 4.2039e-45;
    local_4e8[3] = 0.0;
    local_4c0 = 4;
    local_4a0 = 3;
    local_358._0_8_ = local_538;
    local_538._0_8_ = local_308;
    local_4d8 = uStack_4f0;
    local_4b8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_518;
    local_4b0 = uStack_4f0;
    unique0x10003d24 =
         (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
          *)local_518;
    local_348 = (assign_op<float,_float> *)&local_53c;
    uStack_340 = (float *)local_308;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_358);
    if ((local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
         m_value == 3) &&
       (local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
        m_value == local_2d8)) {
      local_358._0_8_ =
           local_398.
           super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data
      ;
      uStack_510 = (SrcEvaluatorType *)local_538;
      local_538._0_8_ = local_308;
      local_518 = (undefined1  [8])local_358;
      local_508 = (assign_op<float,_float> *)&local_53c;
      uStack_500 = (XprTypeNested)pDVar15;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_518);
      this = local_3d0;
      fVar19 = (float)local_418._4_4_ * (float)local_160;
      fVar22 = (float)local_418._4_4_ * local_160._4_4_;
      afStack_3f0[0] = (float)local_418._4_4_ * (float)uStack_158;
      afStack_3f0[1] = (float)local_418._4_4_ * uStack_158._4_4_;
      local_3f8 = CONCAT44(fVar22,fVar19);
      local_a8 = fStack_40c * local_130;
      fStack_a4 = fStack_40c * fStack_12c;
      fStack_a0 = fStack_40c * fStack_128;
      fStack_9c = fStack_40c *
                  MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0];
      local_448._4_4_ =
           local_404 *
           MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[10];
      uStack_440 = CONCAT44(local_404 *
                            MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0xc],
                            local_404 *
                            MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0xb]);
      local_3c8 = local_138 * fStack_410 + local_150 * (float)local_418._4_4_;
      local_d8 = (float)local_438._4_4_ * local_230;
      fStack_d4 = (float)local_438._4_4_ * fStack_22c;
      fStack_d0 = (float)local_438._4_4_ * fStack_228;
      fStack_cc = (float)local_438._4_4_ * fStack_224;
      MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = fStack_42c * local_200;
      fStack_e4 = fStack_42c * fStack_1fc;
      fStack_e0 = fStack_42c * fStack_1f8;
      fStack_dc = fStack_42c * (float)auStack_1f4._0_4_;
      local_c8 = local_424 * (float)auStack_1f4._36_4_;
      fStack_c4 = local_424 * (float)auStack_1f4._40_4_;
      fStack_c0 = local_424 * (float)auStack_1f4._44_4_;
      fStack_bc = local_424 * (float)auStack_1f4._48_4_;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
           (PointerType)0x0;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)0x0;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride
           = 0;
      uStack_360 = 0;
      local_318 = fStack_410 * (float)local_148;
      fStack_314 = fStack_410 * local_148._4_4_;
      fStack_310 = fStack_410 * fStack_140;
      fStack_30c = fStack_410 * fStack_13c;
      local_b8 = local_408 *
                 MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[3];
      fStack_b4 = local_408 *
                  MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[4];
      fStack_b0 = local_408 *
                  MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[5];
      fStack_ac = local_408 *
                  MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[6];
      lVar12 = 0;
      uVar9 = local_178._0_4_;
      uVar10 = local_178._4_4_;
      uVar11 = local_178._8_4_;
      fVar21 = fStack_16c;
      uVar8 = local_248._8_4_;
      fVar20 = fStack_23c;
      do {
        *(undefined4 *)
         &(pDVar15->
          super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data
             = 0x3f800000;
        lVar12 = lVar12 + 0x10;
        pDVar15 = (DstXprType *)
                  ((long)&(pDVar15->
                          super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_cols.m_value + 4);
      } while (lVar12 != 0x40);
      fVar23 = (float)uVar9 * (float)local_418._0_4_ + fVar19 + local_318 + local_a8 + local_b8;
      fVar24 = (float)uVar10 * (float)local_418._0_4_ + fVar22 + fStack_314 + fStack_a4 + fStack_b4;
      fStack_520 = (float)uVar11 * (float)local_418._0_4_ + afStack_3f0[0] + fStack_310 + fStack_a0
                   + fStack_b0;
      fStack_524 = fVar21 * (float)local_418._0_4_ + afStack_3f0[1] + fStack_30c + fStack_9c +
                   fStack_ac;
      fVar21 = (float)local_248._0_4_ * (float)local_438._0_4_ + local_d8 + fStack_430 * local_218 +
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xf];
      fVar19 = (float)local_248._4_4_ * (float)local_438._0_4_ + fStack_d4 + fStack_430 * fStack_214
               + fStack_e4;
      fVar22 = (float)uVar8 * (float)local_438._0_4_ + fStack_d0 + fStack_430 * fStack_210 +
               fStack_e0;
      fVar20 = fVar20 * (float)local_438._0_4_ + fStack_cc + fStack_430 * fStack_20c + fStack_dc;
      local_258 = 0;
      uStack_250 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_278 = (assign_op<float,_float> *)0x0;
      pDStack_270 = (DstXprType *)0x0;
      local_288 = (undefined1  [8])0x0;
      pSStack_280 = (SrcEvaluatorType *)0x0;
      lVar12 = 0;
      do {
        *pfVar16 = 1.0;
        lVar12 = lVar12 + 0x10;
        pfVar16 = pfVar16 + 5;
      } while (lVar12 != 0x40);
      fVar23 = fVar23 + local_404 *
                        MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[9];
      fVar24 = fVar24 + local_448._4_4_;
      fStack_520 = fStack_520 +
                   local_404 *
                   MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb];
      fStack_524 = fStack_524 +
                   local_404 *
                   MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xc];
      fVar30 = local_168 * (float)local_418._0_4_ + local_3c8 +
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd] * local_404 +
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[7] * local_408 +
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fStack_40c;
      fVar27 = fVar21 + local_428 * (float)auStack_1f4._12_4_ + local_c8;
      fVar28 = fVar19 + local_428 * (float)auStack_1f4._16_4_ + fStack_c4;
      fVar29 = fVar20 + local_428 * (float)auStack_1f4._24_4_ + fStack_bc;
      fVar31 = local_238 * (float)local_438._0_4_ +
               local_208 * fStack_430 + local_220 * (float)local_438._4_4_ +
               (float)auStack_1f4._52_4_ * local_424 + (float)auStack_1f4._28_4_ * local_428 +
               (float)auStack_1f4._4_4_ * fStack_42c;
      fVar20 = fStack_520 *
               (local_234 * (float)local_438._0_4_ +
                fStack_430 * local_204 + (float)local_438._4_4_ * local_21c +
               local_424 * (float)auStack_1f4._56_4_ + local_428 * (float)auStack_1f4._32_4_ +
               fStack_42c * (float)auStack_1f4._8_4_);
      fVar17 = fStack_524 * fVar27;
      fVar26 = fVar24 * fVar31;
      fVar25 = fVar30 * fVar28;
      fVar19 = fVar23 * fVar29;
      fVar21 = (fVar22 + local_428 * (float)auStack_1f4._20_4_ + fStack_c0) *
               (local_164 * (float)local_418._0_4_ +
                fStack_410 * local_134 + (float)local_418._4_4_ * local_14c +
               local_404 *
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xe] +
               local_408 *
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[8] +
               fStack_40c *
               MStack_124.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2]);
      local_528 = ((((fVar20 - fVar17) - fVar26) - fVar25) - fVar19) + fVar21;
      fVar22 = fVar30 * -2.0 * fVar27 +
               (fStack_524 + fStack_524) * fVar28 +
               (fVar23 + fVar23) * fVar31 + fVar24 * -2.0 * fVar29;
      local_458._0_4_ = -fVar22;
      local_458._4_4_ = -0.0;
      fStack_450 = -0.0;
      uStack_44c = -0.0;
      _local_3e8 = ZEXT416((uint)fVar22);
      fVar20 = fVar22 * fVar22 +
               local_528 * -4.0 * (fVar19 + fVar26 + fVar20 + fVar17 + fVar25 + fVar21);
      fVar21 = SQRT(fVar20);
      fStack_51c = fStack_524;
      local_448._0_4_ = fVar21;
      if (fVar20 < 0.0) {
        local_458 = CONCAT44(0x80000000,fVar22) ^ 0x80000000;
        fStack_450 = -0.0;
        uStack_44c = -0.0;
        local_3f8 = (ulong)(uint)fVar20;
        afStack_3f0[0] = 0.0;
        afStack_3f0[1] = 0.0;
        fVar21 = sqrtf(fVar20);
        fVar20 = (float)local_3f8;
      }
      local_528 = local_528 + local_528;
      local_458._0_4_ = ((float)local_458 - fVar21) / local_528;
      fVar21 = (float)local_458;
      if (fVar20 < 0.0) {
        local_448._0_4_ = sqrtf(fVar20);
        fVar21 = (float)local_458;
      }
      if (NAN(fVar21)) {
LAB_001710f8:
        if (local_2a0.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a0.
                          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2a0.
                                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a0.
                                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)this;
      }
      local_318 = fVar21 * fVar21 + 1.0;
      fVar20 = (1.0 - fVar21 * fVar21) / local_318;
      local_3f8 = CONCAT44(local_3f8._4_4_,fVar20);
      uStack_510 = (SrcEvaluatorType *)0x0;
      local_508 = (assign_op<float,_float> *)0x1;
      uStack_500 = (XprTypeNested)0x1;
      local_398.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
           (PointerType)
           CONCAT44(local_398.
                    super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                    .m_data._4_4_,fVar20);
      local_308._0_4_ = (fVar21 * -2.0) / local_318;
      local_518 = (undefined1  [8])&local_398;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_518,
                           (Scalar *)local_308);
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,(Scalar *)local_358);
      local_538._0_8_ = local_538._0_8_ & 0xffffffff00000000;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,(Scalar *)local_538);
      local_53c = ((float)local_458 + (float)local_458) / local_318;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_53c);
      local_39c = (float)local_3f8;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_39c);
      local_3a0 = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3a0);
      local_3a4 = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3a4);
      local_3a8 = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3a8);
      local_3ac = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3ac);
      local_3b0 = 1.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3b0);
      local_3b4 = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3b4);
      local_3b8 = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3b8);
      local_3bc = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3bc);
      local_3c0 = 0.0;
      pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar13,&local_3c0);
      local_3c4 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar13,&local_3c4);
      if (((undefined1 *)
           ((long)&(uStack_510->
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>_>).
                   m_d.data +
           (long)&(((DstXprType *)uStack_500)->
                  super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>)
                  .super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
           ) == (undefined1 *)0x4) && (local_508 == (assign_op<float,_float> *)0x4)) {
        local_538._0_8_ = &local_1b8;
        local_538._8_8_ =
             (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)&local_398;
        Eigen::internal::
        Assignment<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<float,_4,_4,_0,_4,_4> *)local_518,(SrcXprType *)local_538,
              (assign_op<float,_float> *)local_308);
        local_2c8 = local_498;
        local_4d8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                     *)local_538._8_8_;
        pgStack_4c8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)local_538._8_8_;
        local_4c0 = 4;
        fVar20 = *(float *)(DstEvaluatorType **)local_538._8_8_;
        fVar21 = *(float *)((long)(DstEvaluatorType **)local_538._8_8_ + 4);
        fVar19 = *(float *)(local_538._8_8_ + 8);
        fVar22 = *(float *)((long)(local_538._8_8_ + 8) + 4);
        local_308._0_4_ =
             fVar22 * local_4e8[0] +
             fVar19 * (float)local_4f8 + fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_
        ;
        local_308._4_4_ =
             fVar22 * local_4e8[1] +
             fVar19 * local_4f8._4_4_ + fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
        fVar23 = fVar22 * local_4e8[2] +
                 fVar19 * (float)uStack_4f0 +
                 fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
        fVar24 = fVar22 * local_4e8[3] +
                 fVar19 * uStack_4f0._4_4_ + fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_;
        uStack_300 = (DstXprType *)CONCAT44(fVar24,fVar23);
        fVar20 = *(float *)(local_538._8_8_ + 0x10);
        fVar21 = *(float *)((long)(local_538._8_8_ + 0x10) + 4);
        fVar19 = *(float *)(local_538._8_8_ + 0x18);
        fVar22 = *(float *)((long)(local_538._8_8_ + 0x18) + 4);
        fVar17 = fVar22 * local_4e8[0] +
                 fVar19 * (float)local_4f8 +
                 fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
        fVar25 = fVar22 * local_4e8[1] +
                 fVar19 * local_4f8._4_4_ +
                 fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
        fVar26 = fVar22 * local_4e8[2] +
                 fVar19 * (float)uStack_4f0 +
                 fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
        fVar27 = fVar22 * local_4e8[3] +
                 fVar19 * uStack_4f0._4_4_ + fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_;
        local_2f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                     *)CONCAT44(fVar25,fVar17);
        uStack_2f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                      *)CONCAT44(fVar27,fVar26);
        fVar20 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                              *)(local_538._8_8_ + 0x20))->m_dst;
        fVar21 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                     *)(local_538._8_8_ + 0x20))->m_dst + 4);
        fVar19 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                              *)(local_538._8_8_ + 0x20))->m_src;
        fVar22 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                     *)(local_538._8_8_ + 0x20))->m_src + 4);
        local_2e8 = fVar22 * local_4e8[0] +
                    fVar19 * (float)local_4f8 +
                    fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
        fStack_2e4 = fVar22 * local_4e8[1] +
                     fVar19 * local_4f8._4_4_ +
                     fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
        fStack_2e0 = fVar22 * local_4e8[2] +
                     fVar19 * (float)uStack_4f0 +
                     fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
        fStack_2dc = fVar22 * local_4e8[3] +
                     fVar19 * uStack_4f0._4_4_ +
                     fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_;
        fVar20 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                              *)(local_538._8_8_ + 0x20))->m_functor;
        fVar21 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                     *)(local_538._8_8_ + 0x20))->m_functor + 4);
        fVar19 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                              *)(local_538._8_8_ + 0x20))->m_dstExpr;
        fVar22 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                     *)(local_538._8_8_ + 0x20))->m_dstExpr + 4);
        fVar28 = fVar22 * local_4e8[0] +
                 fVar19 * (float)local_4f8 +
                 fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
        fVar29 = fVar22 * local_4e8[1] +
                 fVar19 * local_4f8._4_4_ +
                 fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
        fStack_2d0 = fVar22 * local_4e8[2] +
                     fVar19 * (float)uStack_4f0 +
                     fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
        fStack_2cc = fVar22 * local_4e8[3] +
                     fVar19 * uStack_4f0._4_4_ +
                     fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_;
        local_2d8 = CONCAT44(fVar29,fVar28);
        local_2b0 = 4;
        local_358._4_4_ =
             uStack_490._4_4_ * fVar29 +
             (float)uStack_490 * fStack_2e4 +
             (float)local_498._4_4_ * fVar25 + (float)local_498._0_4_ * (float)local_308._4_4_;
        local_358._0_4_ =
             uStack_490._4_4_ * fVar28 +
             (float)uStack_490 * local_2e8 +
             (float)local_498._4_4_ * fVar17 + (float)local_498._0_4_ * (float)local_308._0_4_;
        stack0xfffffffffffffcb0 =
             (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)CONCAT44(uStack_490._4_4_ * fStack_2cc +
                         (float)uStack_490 * fStack_2dc +
                         (float)local_498._4_4_ * fVar27 + (float)local_498._0_4_ * fVar24,
                         uStack_490._4_4_ * fStack_2d0 +
                         (float)uStack_490 * fStack_2e0 +
                         (float)local_498._4_4_ * fVar26 + (float)local_498._0_4_ * fVar23);
        local_348 = (assign_op<float,_float> *)
                    CONCAT44(uStack_480._4_4_ * fVar29 +
                             (float)uStack_480 * fStack_2e4 +
                             local_488._4_4_ * fVar25 + (float)local_488 * (float)local_308._4_4_,
                             uStack_480._4_4_ * fVar28 +
                             (float)uStack_480 * local_2e8 +
                             local_488._4_4_ * fVar17 + (float)local_488 * (float)local_308._0_4_);
        uStack_340 = (float *)CONCAT44(uStack_480._4_4_ * fStack_2cc +
                                       (float)uStack_480 * fStack_2dc +
                                       local_488._4_4_ * fVar27 + (float)local_488 * fVar24,
                                       uStack_480._4_4_ * fStack_2d0 +
                                       (float)uStack_480 * fStack_2e0 +
                                       local_488._4_4_ * fVar26 + (float)local_488 * fVar23);
        local_338 = uStack_470._4_4_ * fVar28 +
                    (float)uStack_470 * local_2e8 +
                    local_478._4_4_ * fVar17 + (float)local_478 * (float)local_308._0_4_;
        fStack_334 = uStack_470._4_4_ * fVar29 +
                     (float)uStack_470 * fStack_2e4 +
                     local_478._4_4_ * fVar25 + (float)local_478 * (float)local_308._4_4_;
        fStack_330 = uStack_470._4_4_ * fStack_2d0 +
                     (float)uStack_470 * fStack_2e0 +
                     local_478._4_4_ * fVar26 + (float)local_478 * fVar23;
        fStack_32c = uStack_470._4_4_ * fStack_2cc +
                     (float)uStack_470 * fStack_2dc +
                     local_478._4_4_ * fVar27 + (float)local_478 * fVar24;
        local_328 = fStack_45c * fVar28 +
                    fStack_460 * local_2e8 +
                    fStack_464 * fVar17 + local_468 * (float)local_308._0_4_;
        fStack_324 = fStack_45c * fVar29 +
                     fStack_460 * fStack_2e4 +
                     fStack_464 * fVar25 + local_468 * (float)local_308._4_4_;
        fStack_320 = fStack_45c * fStack_2d0 +
                     fStack_460 * fStack_2e0 + fStack_464 * fVar26 + local_468 * fVar23;
        fStack_31c = fStack_45c * fStack_2cc +
                     fStack_460 * fStack_2dc + fStack_464 * fVar27 + local_468 * fVar24;
        iVar3._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8);
        local_4d0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_518;
        local_2c0 = (assign_op<float,_float> *)local_308;
        local_2b8 = local_2c8;
        if (iVar3._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 0x10)) {
          std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
          ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>>
                    (this,iVar3,(Matrix<float,_4,_4,_0,_4,_4> *)local_358);
        }
        else {
          *(ulong *)(((iVar3._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xc) = CONCAT44(fStack_324,local_328);
          *(ulong *)(((iVar3._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xe) = CONCAT44(fStack_31c,fStack_320);
          *(ulong *)(((iVar3._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 8) = CONCAT44(fStack_334,local_338);
          *(ulong *)(((iVar3._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 10) = CONCAT44(fStack_32c,fStack_330);
          *(assign_op<float,_float> **)
           (((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 4) = local_348;
          *(float **)
           (((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 6) = uStack_340;
          *(undefined8 *)
           ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
           m_storage.m_data.array = local_358._0_8_;
          *(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
            **)(((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                m_storage.m_data.array + 2) = stack0xfffffffffffffcb0;
          *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8) = iVar3._M_current + 1;
        }
        local_448._0_4_ = ((float)local_448 - (float)local_3e8._0_4_) / local_528;
        fVar21 = (float)local_448 * (float)local_448 + 1.0;
        fVar20 = (1.0 - (float)local_448 * (float)local_448) / fVar21;
        local_3e8._0_4_ = fVar20;
        _local_528 = CONCAT44(fStack_524,fVar21);
        uStack_510 = (SrcEvaluatorType *)0x0;
        local_508 = (assign_op<float,_float> *)0x1;
        uStack_500 = (XprTypeNested)0x1;
        local_288._0_4_ = fVar20;
        local_308._0_4_ = ((float)local_448 * -2.0) / fVar21;
        local_518 = (undefined1  [8])local_288;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_518,
                             (Scalar *)local_308);
        local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,(Scalar *)local_358);
        local_538._0_8_ = local_538._0_8_ & 0xffffffff00000000;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,(Scalar *)local_538);
        local_53c = ((float)local_448 + (float)local_448) / local_528;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_53c);
        local_39c = (Scalar)local_3e8._0_4_;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_39c);
        local_3a0 = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3a0);
        local_3a4 = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3a4);
        local_3a8 = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3a8);
        local_3ac = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3ac);
        local_3b0 = 1.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3b0);
        local_3b4 = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3b4);
        local_3b8 = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3b8);
        local_3bc = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3bc);
        local_3c0 = 0.0;
        pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                            (pCVar13,&local_3c0);
        local_3c4 = 1.0;
        Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar13,&local_3c4)
        ;
        if (((undefined1 *)
             ((long)&(uStack_510->
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>_>
                     ).m_d.data +
             (long)&(((DstXprType *)uStack_500)->
                    super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
             ) == (undefined1 *)0x4) && (local_508 == (assign_op<float,_float> *)0x4)) {
          local_538._0_8_ = &local_1b8;
          local_538._8_8_ =
               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_288;
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,_4,_4,_0,_4,_4> *)local_518,(SrcXprType *)local_538,
                (assign_op<float,_float> *)local_308);
          local_2c8 = local_498;
          local_4d8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)local_538._8_8_;
          pgStack_4c8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                         *)local_538._8_8_;
          local_4c0 = 4;
          fVar20 = *(float *)(DstEvaluatorType **)local_538._8_8_;
          fVar21 = *(float *)((long)(DstEvaluatorType **)local_538._8_8_ + 4);
          fVar19 = *(float *)(local_538._8_8_ + 8);
          fVar22 = *(float *)((long)(local_538._8_8_ + 8) + 4);
          local_308._0_4_ =
               fVar22 * local_4e8[0] +
               fVar19 * (float)local_4f8 +
               fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
          local_308._4_4_ =
               fVar22 * local_4e8[1] +
               fVar19 * local_4f8._4_4_ + fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_
          ;
          fVar23 = fVar22 * local_4e8[2] +
                   fVar19 * (float)uStack_4f0 +
                   fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
          fVar24 = fVar22 * local_4e8[3] +
                   fVar19 * uStack_4f0._4_4_ + fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_
          ;
          uStack_300 = (DstXprType *)CONCAT44(fVar24,fVar23);
          fVar20 = *(float *)(local_538._8_8_ + 0x10);
          fVar21 = *(float *)((long)(local_538._8_8_ + 0x10) + 4);
          fVar19 = *(float *)(local_538._8_8_ + 0x18);
          fVar22 = *(float *)((long)(local_538._8_8_ + 0x18) + 4);
          fVar17 = fVar22 * local_4e8[0] +
                   fVar19 * (float)local_4f8 +
                   fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
          fVar25 = fVar22 * local_4e8[1] +
                   fVar19 * local_4f8._4_4_ +
                   fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
          fVar26 = fVar22 * local_4e8[2] +
                   fVar19 * (float)uStack_4f0 +
                   fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
          fVar27 = fVar22 * local_4e8[3] +
                   fVar19 * uStack_4f0._4_4_ + fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_
          ;
          local_2f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)CONCAT44(fVar25,fVar17);
          uStack_2f0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                        *)CONCAT44(fVar27,fVar26);
          fVar20 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                *)(local_538._8_8_ + 0x20))->m_dst;
          fVar21 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                       *)(local_538._8_8_ + 0x20))->m_dst + 4);
          fVar19 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                *)(local_538._8_8_ + 0x20))->m_src;
          fVar22 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                       *)(local_538._8_8_ + 0x20))->m_src + 4);
          local_2e8 = fVar22 * local_4e8[0] +
                      fVar19 * (float)local_4f8 +
                      fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
          fStack_2e4 = fVar22 * local_4e8[1] +
                       fVar19 * local_4f8._4_4_ +
                       fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
          fStack_2e0 = fVar22 * local_4e8[2] +
                       fVar19 * (float)uStack_4f0 +
                       fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
          fStack_2dc = fVar22 * local_4e8[3] +
                       fVar19 * uStack_4f0._4_4_ +
                       fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_;
          fVar20 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                *)(local_538._8_8_ + 0x20))->m_functor;
          fVar21 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                       *)(local_538._8_8_ + 0x20))->m_functor + 4);
          fVar19 = *(float *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                *)(local_538._8_8_ + 0x20))->m_dstExpr;
          fVar22 = *(float *)((long)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                                       *)(local_538._8_8_ + 0x20))->m_dstExpr + 4);
          fVar28 = fVar22 * local_4e8[0] +
                   fVar19 * (float)local_4f8 +
                   fVar21 * (float)local_508 + fVar20 * (float)local_518._0_4_;
          fVar29 = fVar22 * local_4e8[1] +
                   fVar19 * local_4f8._4_4_ +
                   fVar21 * local_508._4_4_ + fVar20 * (float)local_518._4_4_;
          fStack_2d0 = fVar22 * local_4e8[2] +
                       fVar19 * (float)uStack_4f0 +
                       fVar21 * (float)uStack_500 + fVar20 * (float)uStack_510;
          fStack_2cc = fVar22 * local_4e8[3] +
                       fVar19 * uStack_4f0._4_4_ +
                       fVar21 * uStack_500._4_4_ + fVar20 * uStack_510._4_4_;
          local_2d8 = CONCAT44(fVar29,fVar28);
          local_2b0 = 4;
          local_358._4_4_ =
               uStack_490._4_4_ * fVar29 +
               (float)uStack_490 * fStack_2e4 +
               (float)local_498._4_4_ * fVar25 + (float)local_498._0_4_ * (float)local_308._4_4_;
          local_358._0_4_ =
               uStack_490._4_4_ * fVar28 +
               (float)uStack_490 * local_2e8 +
               (float)local_498._4_4_ * fVar17 + (float)local_498._0_4_ * (float)local_308._0_4_;
          stack0xfffffffffffffcb0 =
               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)CONCAT44(uStack_490._4_4_ * fStack_2cc +
                           (float)uStack_490 * fStack_2dc +
                           (float)local_498._4_4_ * fVar27 + (float)local_498._0_4_ * fVar24,
                           uStack_490._4_4_ * fStack_2d0 +
                           (float)uStack_490 * fStack_2e0 +
                           (float)local_498._4_4_ * fVar26 + (float)local_498._0_4_ * fVar23);
          local_348 = (assign_op<float,_float> *)
                      CONCAT44(uStack_480._4_4_ * fVar29 +
                               (float)uStack_480 * fStack_2e4 +
                               local_488._4_4_ * fVar25 + (float)local_488 * (float)local_308._4_4_,
                               uStack_480._4_4_ * fVar28 +
                               (float)uStack_480 * local_2e8 +
                               local_488._4_4_ * fVar17 + (float)local_488 * (float)local_308._0_4_)
          ;
          uStack_340 = (float *)CONCAT44(uStack_480._4_4_ * fStack_2cc +
                                         (float)uStack_480 * fStack_2dc +
                                         local_488._4_4_ * fVar27 + (float)local_488 * fVar24,
                                         uStack_480._4_4_ * fStack_2d0 +
                                         (float)uStack_480 * fStack_2e0 +
                                         local_488._4_4_ * fVar26 + (float)local_488 * fVar23);
          local_338 = uStack_470._4_4_ * fVar28 +
                      (float)uStack_470 * local_2e8 +
                      local_478._4_4_ * fVar17 + (float)local_478 * (float)local_308._0_4_;
          fStack_334 = uStack_470._4_4_ * fVar29 +
                       (float)uStack_470 * fStack_2e4 +
                       local_478._4_4_ * fVar25 + (float)local_478 * (float)local_308._4_4_;
          fStack_330 = uStack_470._4_4_ * fStack_2d0 +
                       (float)uStack_470 * fStack_2e0 +
                       local_478._4_4_ * fVar26 + (float)local_478 * fVar23;
          fStack_32c = uStack_470._4_4_ * fStack_2cc +
                       (float)uStack_470 * fStack_2dc +
                       local_478._4_4_ * fVar27 + (float)local_478 * fVar24;
          local_328 = fStack_45c * fVar28 +
                      fStack_460 * local_2e8 +
                      fStack_464 * fVar17 + local_468 * (float)local_308._0_4_;
          fStack_324 = fStack_45c * fVar29 +
                       fStack_460 * fStack_2e4 +
                       fStack_464 * fVar25 + local_468 * (float)local_308._4_4_;
          fStack_320 = fStack_45c * fStack_2d0 +
                       fStack_460 * fStack_2e0 + fStack_464 * fVar26 + local_468 * fVar23;
          fStack_31c = fStack_45c * fStack_2cc +
                       fStack_460 * fStack_2dc + fStack_464 * fVar27 + local_468 * fVar24;
          iVar3._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8);
          local_4d0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_518;
          local_2c0 = (assign_op<float,_float> *)local_308;
          local_2b8 = local_2c8;
          if (iVar3._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 0x10)) {
            std::
            vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
            _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>>
                      (this,iVar3,(Matrix<float,_4,_4,_0,_4,_4> *)local_358);
          }
          else {
            *(ulong *)(((iVar3._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xc) = CONCAT44(fStack_324,local_328);
            *(ulong *)(((iVar3._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xe) = CONCAT44(fStack_31c,fStack_320);
            *(ulong *)(((iVar3._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 8) = CONCAT44(fStack_334,local_338);
            *(ulong *)(((iVar3._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 10) = CONCAT44(fStack_32c,fStack_330);
            *(assign_op<float,_float> **)
             (((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage.m_data.array + 4) = local_348;
            *(float **)
             (((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage.m_data.array + 6) = uStack_340;
            *(undefined8 *)
             ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
             m_storage.m_data.array = local_358._0_8_;
            *(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
              **)(((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                  m_storage.m_data.array + 2) = stack0xfffffffffffffcb0;
            *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8) = iVar3._M_current + 1;
          }
          goto LAB_001710f8;
        }
      }
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 4, 4>>::finished() [MatrixType = Eigen::Matrix<float, 4, 4>]"
                   );
    }
  }
  local_538._0_8_ = local_308;
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 6, 6>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 6, 6>>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1L1Q1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 1 || plPair.size() < 1){
		std::cerr << "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec,4,1> P1,P1_B,Pi,Pi_B,Q1,Q2,R1_B,R2_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;
	Pi = plPair[0].first; Pi_B = plPair[0].second;

	Q1 = lPair[0].first.first; Q2 = lPair[0].first.second;
	R1_B = lPair[0].second.first; R2_B = lPair[0].second.second;

	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP1, tP2, tQ1, tQ2;
	tP1 = Q1.head(3) / Q1(3);
	tP2 = Q2.head(3) / Q2(3);
	tQ1 = R1_B.head(3) / R1_B(3);
	tQ2 = R2_B.head(3) / R2_B(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3,1> D1 = tP2 - tP1;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP2.cross(tP1);
	L1 /= L1.head(3).norm();
	// starting from line 2
	Matrix<floatPrec, 3,1> D2 = tQ2 - tQ1;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tQ2.cross(tQ1);
	L2 /= L2.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations1L1Q1P<floatPrec>(P1, P1_B, Pi, Pi_B);

	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_2, L2_2;
	L1_2 = transLineU * L1;
	L2_2 = transLineV * L2;

	// compute rotation around Z axis
	// initialize two transformation solutions
	Matrix<floatPrec, 4,4> TF1, TF2;
	TF1.setIdentity(4,4);
	TF2.setIdentity(4,4);

	// compute polynomial coefficients
	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26;
	l11 = L1_2[0];
	l12 = L1_2[1];
	l13 = L1_2[2];
	l14 = L1_2[3];
	l15 = L1_2[4];
	l16 = L1_2[5];
	l21 = L2_2[0];
	l22 = L2_2[1];
	l23 = L2_2[2];
	l24 = L2_2[3];
	l25 = L2_2[4];
	l26 = L2_2[5];
	floatPrec a, b, c;
	a = l13 * l26 - l14 * l21 - l12 * l25 - l15 * l22 - l11 * l24 + l16 * l23;
	b = 2 * l11 * l25 - 2 * l12 * l24 + 2 * l14 * l22 - 2 * l15 * l21;
	c = l11 * l24 + l12 * l25 + l13 * l26 + l14 * l21 + l15 * l22 + l16 * l23;

	// apply quadratic formula
	floatPrec s1, s2;
	s1 = (-b - sqrt(b * b - 4 * a * c)) / (2 * a);
	s2 = (-b + sqrt(b * b - 4 * a * c)) / (2 * a);

	if(!isnan(s1)){
		TF1 << (1 - s1 * s1) / (1 + s1 * s1), -2 * s1 / (1 + s1 * s1), 0, 0,
			2 * s1 / (1 + s1 * s1), (1 - s1 * s1) / (1 + s1 * s1), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF1 * TU);
		TF2 << (1 - s2 * s2) / (1 + s2 * s2), -2 * s2 / (1 + s2 * s2), 0, 0,
			2 * s2 / (1 + s2 * s2), (1 - s2 * s2) / (1 + s2 * s2), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF2 * TU);


	}
	return out;
}